

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzer.cpp
# Opt level: O0

U32 __thiscall
LINAnalyzer::GenerateSimulationData
          (LINAnalyzer *this,U64 minimum_sample_index,U32 device_sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  element_type *settings;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 device_sample_rate_local;
  U64 minimum_sample_index_local;
  LINAnalyzer *this_local;
  
  if ((this->mSimulationInitilized & 1U) == 0) {
    UVar1 = Analyzer::GetSimulationSampleRate();
    settings = std::auto_ptr<LINAnalyzerSettings>::get(&this->mSettings);
    LINSimulationDataGenerator::Initialize(&this->mSimulationDataGenerator,UVar1,settings);
    this->mSimulationInitilized = true;
  }
  UVar1 = LINSimulationDataGenerator::GenerateSimulationData
                    (&this->mSimulationDataGenerator,minimum_sample_index,device_sample_rate,
                     simulation_channels);
  return UVar1;
}

Assistant:

U32 LINAnalyzer::GenerateSimulationData( U64 minimum_sample_index, U32 device_sample_rate,
                                         SimulationChannelDescriptor** simulation_channels )
{
    if( mSimulationInitilized == false )
    {
        mSimulationDataGenerator.Initialize( GetSimulationSampleRate(), mSettings.get() );
        mSimulationInitilized = true;
    }

    return mSimulationDataGenerator.GenerateSimulationData( minimum_sample_index, device_sample_rate, simulation_channels );
}